

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Mapper004.cpp
# Opt level: O2

uint32_t __thiscall Mapper004::calcRBankOffset(Mapper004 *this,uint8_t idx)

{
  undefined3 in_register_00000031;
  
  return (CONCAT31(in_register_00000031,idx) & 0xffff) % ((uint)this->params->sizePrgRom * 2) << 0xd
  ;
}

Assistant:

uint32_t Mapper004::calcRBankOffset(uint8_t idx) {
    if (idx > 0x80) {
        idx -= 0x100;
    }
    idx %= ((params->sizePrgRom * 16384) / 0x2000);
    int32_t offset = idx * 0x2000;
    if (offset < 0) {
        offset += (params->sizePrgRom * 16384);
    }
    return uint32_t(offset);
}